

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key)

{
  int iVar1;
  uint64_t local_78;
  uECC_word_t private [4];
  EccPoint public;
  
  vli_bytesToNative(&local_78,private_key);
  iVar1 = EccPoint_compute_public_key((EccPoint *)(private + 3),&local_78);
  if (iVar1 != 0) {
    vli_nativeToBytes(public_key,private + 3);
    vli_nativeToBytes(public_key + 0x20,public.x + 3);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int uECC_compute_public_key(const uint8_t private_key[uECC_BYTES],
                            uint8_t public_key[uECC_BYTES * 2]) {
    uECC_word_t private[uECC_WORDS];
    EccPoint public;

    vli_bytesToNative(private, private_key);

    if (!EccPoint_compute_public_key(&public, private)) {
        return 0;
    }

    vli_nativeToBytes(public_key, public.x);
    vli_nativeToBytes(public_key + uECC_BYTES, public.y);
    return 1;
}